

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_bytedata.h
# Opt level: O1

ByteData * __thiscall
cfd::core::ByteData::Concat<cfd::core::ByteData256,cfd::core::ByteData,cfd::core::ByteData>
          (ByteData *__return_storage_ptr__,ByteData *this,ByteData256 *top,ByteData *args,
          ByteData *args_1)

{
  ByteData result;
  ByteData local_38;
  
  Concat<cfd::core::ByteData256>(&local_38,this,top);
  Concat<cfd::core::ByteData,cfd::core::ByteData>(__return_storage_ptr__,&local_38,args,args_1);
  if (local_38.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

ByteData Concat(const ByteTop& top, const ByteDataClass&... args) const {
    ByteData result = Concat(top);
    return result.Concat(args...);
  }